

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_ping_pong.c
# Opt level: O2

int main(int argc,char **argv)

{
  cio_error cVar1;
  cio_address_family cVar2;
  __sighandler_t p_Var3;
  cio_inet_address *inet_address_00;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  cio_inet_address inet_address;
  cio_server_socket server_socket;
  cio_socket_address endpoint;
  cio_socket socket;
  cio_socket_address local_21c;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  
  if ((argc != 2) || (max_pings = strtoul(argv[1],(char **)0x0,10), max_pings == 0xffffffffffffffff)
     ) {
    usage(*argv);
    return 1;
  }
  p_Var3 = signal(0xf,sighandler);
  if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
    pcVar5 = "could no install SIGTERM handler!\n";
    sVar6 = 0x22;
LAB_00101569:
    fwrite(pcVar5,sVar6,1,_stderr);
    return 1;
  }
  p_Var3 = signal(2,sighandler);
  if (p_Var3 == (__sighandler_t)0xffffffffffffffff) {
    fwrite("could no install SIGINT handler!\n",0x21,1,_stderr);
    signal(0xf,(__sighandler_t)0x0);
    return 1;
  }
  inet_address_00 = cio_get_inet_address_any4();
  cVar1 = cio_init_inet_socket_address(&endpoint,inet_address_00,0x3039);
  if (cVar1 != CIO_SUCCESS) {
    pcVar5 = "could no init server socket endpoint!\n";
    sVar6 = 0x26;
    goto LAB_00101569;
  }
  cVar1 = cio_eventloop_init(&loop);
  if (cVar1 != CIO_SUCCESS) {
    return 1;
  }
  cVar2 = cio_socket_address_get_family(&endpoint);
  cVar1 = cio_server_socket_init
                    (&server_socket,&loop,5,cVar2,alloc_echo_client,free_echo_client,1000000000,
                     (cio_server_socket_close_hook_t)0x0);
  if (cVar1 == CIO_SUCCESS) {
    cVar1 = cio_server_socket_set_tcp_fast_open(&server_socket,true);
    if (cVar1 == CIO_SUCCESS) {
      uVar4 = 1;
      cVar1 = cio_server_socket_set_reuse_address(&server_socket,true);
      if (cVar1 == CIO_SUCCESS) {
        cVar1 = cio_server_socket_bind(&server_socket,&endpoint);
        if (cVar1 == CIO_SUCCESS) {
          cVar1 = cio_server_socket_accept(&server_socket,handle_accept,(void *)0x0);
          if (cVar1 == CIO_SUCCESS) {
            local_1a8 = 0;
            uStack_1a0 = 0;
            cVar2 = cio_socket_address_get_family(&endpoint);
            cVar1 = cio_init_inet_address(&inet_address,"\x7f",4);
            if (cVar1 == CIO_SUCCESS) {
              cVar1 = cio_init_inet_socket_address(&local_21c,&inet_address,0x3039);
              if ((cVar1 != CIO_SUCCESS) ||
                 (cVar1 = cio_socket_init(&socket,cVar2,&loop,1000000000,client_socket_close_hook),
                 cVar1 != CIO_SUCCESS)) {
                pcVar5 = "could not init client socket endpoint!\n";
                sVar6 = 0x27;
                goto LAB_00101697;
              }
              cVar1 = cio_socket_set_tcp_fast_open(&socket,true);
              if (cVar1 == CIO_SUCCESS) {
                cVar1 = cio_socket_connect(&socket,&local_21c,handle_connect,&local_1a8);
                if (cVar1 != CIO_SUCCESS) {
                  pcVar5 = "could not connect to server!\n";
                  sVar6 = 0x1d;
                  goto LAB_001015af;
                }
                cVar1 = cio_eventloop_run(&loop);
                uVar4 = (uint)(cVar1 != CIO_SUCCESS);
              }
              else {
                pcVar5 = "could not enable TCP FASTOPEN for active (connect) socket!\n";
                sVar6 = 0x3b;
LAB_001015af:
                fwrite(pcVar5,sVar6,1,_stderr);
                cio_socket_close(&socket);
              }
            }
            else {
              pcVar5 = "could not init client socket inet address!\n";
              sVar6 = 0x2b;
LAB_00101697:
              fwrite(pcVar5,sVar6,1,_stderr);
            }
            cio_server_socket_close(&server_socket);
            goto LAB_00101531;
          }
          pcVar5 = "could not run accept on server socket!\n";
          sVar6 = 0x27;
        }
        else {
          pcVar5 = "could not bind server socket!\n";
          sVar6 = 0x1e;
        }
      }
      else {
        pcVar5 = "could not set reuse_address for server socket!\n";
        sVar6 = 0x2f;
      }
    }
    else {
      pcVar5 = "could not set TCP FASTOPEN for server socket!\n";
      sVar6 = 0x2e;
    }
    fwrite(pcVar5,sVar6,1,_stderr);
    cio_server_socket_close(&server_socket);
  }
  else {
    fwrite("could not init server socket!\n",0x1e,1,_stderr);
  }
  uVar4 = 0;
LAB_00101531:
  cio_eventloop_destroy(&loop);
  return uVar4;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 2) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	max_pings = strtoul(argv[1], NULL, BASE_10);
	if (max_pings == ULLONG_MAX) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	int ret = EXIT_SUCCESS;
	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGTERM handler!\n");
		return EXIT_FAILURE;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)fprintf(stderr, "could no install SIGINT handler!\n");
		(void)signal(SIGTERM, SIG_DFL);
		return EXIT_FAILURE;
	}

	struct cio_socket_address endpoint;
	enum cio_error err = cio_init_inet_socket_address(&endpoint, cio_get_inet_address_any4(), SERVERSOCKET_LISTEN_PORT);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could no init server socket endpoint!\n");
		return EXIT_FAILURE;
	}

	err = cio_eventloop_init(&loop);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return EXIT_FAILURE;
	}

	struct cio_server_socket server_socket;
	err = init_server(&server_socket, &endpoint);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		goto destroy_loop;
	}

	struct cio_socket socket;
	struct client client;
	client.bytes_read = 0;
	client.number_of_pings = 0;
	err = init_client(&socket, cio_socket_address_get_family(&endpoint), &client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		ret = EXIT_FAILURE;
		goto close_server_socket;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
	}

close_server_socket:
	cio_server_socket_close(&server_socket);
destroy_loop:
	cio_eventloop_destroy(&loop);
	return ret;
}